

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O0

void __thiscall
spdlog::details::circular_q<spdlog::details::log_msg_buffer>::push_back
          (circular_q<spdlog::details::log_msg_buffer> *this,log_msg_buffer *item)

{
  log_msg_buffer *in_RDI;
  log_msg_buffer *unaff_retaddr;
  log_msg_buffer *other;
  
  if ((in_RDI->super_log_msg).logger_name.data_ != (char *)0x0) {
    other = in_RDI;
    std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
    operator[]((vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
                *)&(in_RDI->super_log_msg).thread_id,*(size_type *)&(in_RDI->super_log_msg).level);
    log_msg_buffer::operator=(unaff_retaddr,other);
    *(ulong *)&(in_RDI->super_log_msg).level =
         (*(long *)&(in_RDI->super_log_msg).level + 1U) %
         (ulong)(in_RDI->super_log_msg).logger_name.data_;
    if (*(size_t *)&(in_RDI->super_log_msg).level == (in_RDI->super_log_msg).logger_name.size_) {
      (in_RDI->super_log_msg).logger_name.size_ =
           ((in_RDI->super_log_msg).logger_name.size_ + 1) %
           (ulong)(in_RDI->super_log_msg).logger_name.data_;
      (in_RDI->super_log_msg).time.__d.__r = (in_RDI->super_log_msg).time.__d.__r + 1;
    }
  }
  return;
}

Assistant:

void push_back(T &&item)
    {
        if (max_items_ > 0)
        {
            v_[tail_] = std::move(item);
            tail_ = (tail_ + 1) % max_items_;

            if (tail_ == head_) // overrun last item if full
            {
                head_ = (head_ + 1) % max_items_;
                ++overrun_counter_;
            }
        }
    }